

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O0

void __thiscall IRT::CEseqFloatVisitor::Visit(CEseqFloatVisitor *this,CSeqStatement *statement)

{
  CStatement *pCVar1;
  CSeqStatement *this_00;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_50;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_48;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_40;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_38;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> right;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_20;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> left;
  CSeqStatement *statement_local;
  CEseqFloatVisitor *this_local;
  
  left._M_t.
  super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
  super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
        )(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
          )statement;
  pCVar1 = CSeqStatement::LeftStatement(statement);
  (**(pCVar1->super_IStatement).super_INode._vptr_INode)(pCVar1,this);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_20,&this->childStatement);
  pCVar1 = CSeqStatement::RightStatement
                     ((CSeqStatement *)
                      left._M_t.
                      super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
                      .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl);
  (**(pCVar1->super_IStatement).super_INode._vptr_INode)(pCVar1,this);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_38,&this->childStatement);
  this_00 = (CSeqStatement *)operator_new(0x18);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_48,&local_20);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_50,&local_38);
  CSeqStatement::CSeqStatement(this_00,&local_48,&local_50);
  std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
  unique_ptr<std::default_delete<IRT::CStatement_const>,void>
            ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
             &local_40,(pointer)this_00);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::operator=
            (&this->childStatement,&local_40);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_40);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_50);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_48);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_38);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_20);
  return;
}

Assistant:

void IRT::CEseqFloatVisitor::Visit(const IRT::CSeqStatement &statement) {
    statement.LeftStatement()->Accept(*this);
    std::unique_ptr<const CStatement> left = std::move(childStatement);

    statement.RightStatement()->Accept(*this);
    std::unique_ptr<const CStatement> right = std::move(childStatement);

    childStatement = SMOVE_UNIQ(new CSeqStatement(
            std::move(left),
            std::move(right)
    ));
}